

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::enterInitializingModeComplete(Federate *this)

{
  Modes MVar1;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  bool bVar2;
  InvalidFunctionCall *this_01;
  string_view message;
  handle asyncInfo;
  unique_lock<std::mutex> local_28;
  
  if ((this->singleThreadFederate != true) && (MVar1 = (this->currentMode)._M_i, MVar1 != STARTUP))
  {
    if (MVar1 != INITIALIZING) {
      if (MVar1 != PENDING_INIT) {
        this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
        message._M_str =
             "cannot call Initialization Complete function without first calling enterInitializingModeAsync function or being in startup mode"
        ;
        message._M_len = 0x7f;
        InvalidFunctionCall::InvalidFunctionCall(this_01,message);
        __cxa_throw(this_01,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
      }
      this_00 = (this->asyncCallInfo)._M_t.
                super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                .
                super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
                ._M_head_impl;
      local_28._M_device = &this_00->m_mutex;
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      bVar2 = std::future<bool>::get((future<bool> *)this_00);
      if (bVar2) {
        enteringInitializingMode(this,NEXT_STEP);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
    }
    return;
  }
  enterInitializingMode(this);
  return;
}

Assistant:

void Federate::enterInitializingModeComplete()
{
    if (singleThreadFederate) {
        return enterInitializingMode();
    }
    switch (currentMode.load()) {
        case Modes::PENDING_INIT: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                if (asyncInfo->initFuture.get()) {
                    enteringInitializingMode(IterationResult::NEXT_STEP);
                }
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        } break;
        case Modes::INITIALIZING:
            break;
        case Modes::STARTUP:
            enterInitializingMode();
            break;
        default:
            throw(InvalidFunctionCall(
                "cannot call Initialization Complete function without first calling "
                "enterInitializingModeAsync function or being in startup mode"));
    }
}